

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dorpi.cpp
# Opt level: O2

void __thiscall numerary::TestDorpi::test_dorpi::test_method(test_dorpi *this)

{
  double *y;
  double in_XMM1_Qa;
  short result;
  short expected_result;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  undefined8 local_c0;
  assertion_result local_b8;
  const_string local_a0;
  char *local_90;
  char *local_88;
  const_string local_80;
  const_string local_70;
  char *local_60;
  char *local_58;
  const_string local_50;
  const_string local_40;
  
  y = (double *)operator_new__(0x10);
  *y = 3.0;
  expected_result = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"dorpi_4_5",(allocator<char> *)&local_b8);
  result = Numerary::ordinary_differential_equations
                     (test_dorpi_function_1,y,1.0,in_XMM1_Qa,2.0,(string *)local_d8);
  std::__cxx11::string::~string((string *)local_d8);
  local_40.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_dorpi.cpp";
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x20,&local_50);
  local_d8[8] = false;
  local_d8._0_8_ = &PTR__lazy_ostream_001d3c50;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (long)"\t" + 1;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_dorpi.cpp";
  local_58 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,short,short>
            (local_d8,&local_60,0x20,1,2,&result,"result",&expected_result,"expected_result");
  local_70.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_dorpi.cpp";
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x22,&local_80);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(ABS(36.0 - y[1]) < 0.0001);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = &local_90;
  local_90 = "fabs(expected_answer - y[1]) < 1.e-4";
  local_88 = "";
  local_d8[8] = false;
  local_d8._0_8_ = &PTR__lazy_ostream_001d3cd0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_dorpi.cpp";
  local_a0.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,(lazy_ostream *)local_d8,&local_a0,0x22,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  operator_delete__(y);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_dorpi)
    {
        double *y = new double[2];
        double x0, x, h, expected_answer;
        short int expected_result, result;

        // Initial points
        x0 = 1; y[0] = 3;

        x = 2.0;

        expected_result = 0;
        expected_answer = 36;
        result = Numerary::ordinary_differential_equations(test_dorpi_function_1, y, x0, h, x, "dorpi_4_5");
        BOOST_CHECK_EQUAL(result, expected_result);

        BOOST_CHECK(fabs(expected_answer - y[1]) < 1.e-4);

        delete[] y;
    }